

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O3

void __thiscall
duckdb::CSVFileHandle::CSVFileHandle
          (CSVFileHandle *this,DBConfig *config,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
          *file_handle_p,OpenFileInfo *file_p,CSVReaderOptions *options)

{
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_00;
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  pointer pFVar5;
  idx_t iVar6;
  pointer *__ptr;
  
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->compression_type = options->compression;
  this_00 = &this->file_handle;
  (this->file_handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       (file_handle_p->
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (file_handle_p->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  CSVEncoder::CSVEncoder
            (&this->encoder,config,&options->encoding,(options->buffer_size_option).value);
  (this->file).path._M_dataplus._M_p = (pointer)&(this->file).path.field_2;
  pcVar1 = (file_p->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar1,pcVar1 + (file_p->path)._M_string_length);
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file_p->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->can_seek = false;
  this->on_disk_file = false;
  this->is_pipe = false;
  this->uncompressed_bytes_read = 0;
  this->file_size = 0;
  *(undefined8 *)((long)&this->file_size + 1) = 0;
  *(undefined8 *)((long)&this->requested_bytes + 1) = 0;
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar3 = FileHandle::CanSeek(pFVar5);
  this->can_seek = bVar3;
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar3 = FileHandle::OnDiskFile(pFVar5);
  this->on_disk_file = bVar3;
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  iVar6 = FileHandle::GetFileSize(pFVar5);
  this->file_size = iVar6;
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar3 = FileHandle::IsPipe(pFVar5);
  this->is_pipe = bVar3;
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  iVar4 = (*pFVar5->_vptr_FileHandle[3])(pFVar5);
  this->compression_type = (FileCompressionType)iVar4;
  return;
}

Assistant:

CSVFileHandle::CSVFileHandle(DBConfig &config, unique_ptr<FileHandle> file_handle_p, const OpenFileInfo &file_p,
                             const CSVReaderOptions &options)
    : compression_type(options.compression), file_handle(std::move(file_handle_p)),
      encoder(config, options.encoding, options.buffer_size_option.GetValue()), file(file_p) {
	can_seek = file_handle->CanSeek();
	on_disk_file = file_handle->OnDiskFile();
	file_size = file_handle->GetFileSize();
	is_pipe = file_handle->IsPipe();
	compression_type = file_handle->GetFileCompressionType();
}